

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O0

void okim6258_write(void *chip,UINT8 offset,UINT8 data)

{
  UINT8 data_local;
  UINT8 offset_local;
  void *chip_local;
  
  switch(offset) {
  case '\0':
    okim6258_ctrl_w(chip,data);
    break;
  case '\x01':
    okim6258_data_w(chip,data);
    break;
  case '\x02':
    okim6258_pan_w(chip,data);
    break;
  case '\b':
  case '\t':
  case '\n':
    okim6258_set_clock_byte(chip,offset & 3,data);
    break;
  case '\v':
    okim6258_set_clock_byte(chip,offset & 3,data);
    okim6258_set_clock(chip,0);
    break;
  case '\f':
    okim6258_set_divider(chip,data);
  }
  return;
}

Assistant:

static void okim6258_write(void *chip, UINT8 offset, UINT8 data)
{
	switch(offset)
	{
	case 0x00:
		okim6258_ctrl_w(chip, data);
		break;
	case 0x01:
		okim6258_data_w(chip, data);
		break;
	case 0x02:
		okim6258_pan_w(chip, data);
		break;
	case 0x08:
	case 0x09:
	case 0x0A:
		okim6258_set_clock_byte(chip, offset & 0x03, data);
		break;
	case 0x0B:
		okim6258_set_clock_byte(chip, offset & 0x03, data);
		okim6258_set_clock(chip, 0);	// refresh clock
		break;
	case 0x0C:
		okim6258_set_divider(chip, data);
		break;
	}
	
	return;
}